

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaCSat2.c
# Opt level: O1

Cbs2_Man_t * Cbs2_ManAlloc(Gia_Man_t *pGia)

{
  int iVar1;
  uint uVar2;
  ulong uVar3;
  Cbs2_Man_t *pCVar4;
  int *piVar5;
  Vec_Int_t *pVVar6;
  char *pcVar7;
  long lVar8;
  size_t sVar9;
  int iVar10;
  
  pCVar4 = (Cbs2_Man_t *)calloc(1,400);
  (pCVar4->pClauses).nSize = 10000;
  (pCVar4->pJust).nSize = 10000;
  (pCVar4->pProp).nSize = 10000;
  piVar5 = (int *)malloc(40000);
  (pCVar4->pProp).pData = piVar5;
  piVar5 = (int *)malloc(40000);
  (pCVar4->pJust).pData = piVar5;
  piVar5 = (int *)malloc(40000);
  (pCVar4->pClauses).pData = piVar5;
  (pCVar4->pClauses).iHead = 1;
  (pCVar4->pClauses).iTail = 1;
  pVVar6 = (Vec_Int_t *)malloc(0x10);
  pVVar6->nCap = 1000;
  pVVar6->nSize = 0;
  piVar5 = (int *)malloc(4000);
  pVVar6->pArray = piVar5;
  pCVar4->vModel = pVVar6;
  pVVar6 = (Vec_Int_t *)malloc(0x10);
  pVVar6->nCap = 1000;
  pVVar6->nSize = 0;
  piVar5 = (int *)malloc(4000);
  pVVar6->pArray = piVar5;
  pCVar4->vTemp = pVVar6;
  pCVar4->pAig = pGia;
  (pCVar4->Pars).nBTLimit = 0;
  (pCVar4->Pars).nJustLimit = 0;
  (pCVar4->Pars).nBTThis = 0;
  (pCVar4->Pars).nBTThisNc = 0;
  (pCVar4->Pars).nJustThis = 0;
  (pCVar4->Pars).nBTTotal = 0;
  (pCVar4->Pars).nJustTotal = 0;
  (pCVar4->Pars).fUseHighest = 0;
  (pCVar4->Pars).nBTLimit = 1000;
  (pCVar4->Pars).nJustLimit = 500;
  (pCVar4->Pars).fUseHighest = 1;
  (pCVar4->Pars).fUseLowest = 0;
  (pCVar4->Pars).fUseMaxFF = 0;
  (pCVar4->Pars).fUseFanout = 1;
  (pCVar4->Pars).fVerbose = 1;
  iVar1 = pGia->nObjs;
  if ((pCVar4->vAssign).nCap < iVar1) {
    pcVar7 = (pCVar4->vAssign).pArray;
    if (pcVar7 == (char *)0x0) {
      pcVar7 = (char *)malloc((long)iVar1);
    }
    else {
      pcVar7 = (char *)realloc(pcVar7,(long)iVar1);
    }
    (pCVar4->vAssign).pArray = pcVar7;
    (pCVar4->vAssign).nCap = iVar1;
  }
  (pCVar4->vAssign).nSize = iVar1;
  if (0 < iVar1) {
    lVar8 = 0;
    do {
      (pCVar4->vAssign).pArray[lVar8] = '\x02';
      lVar8 = lVar8 + 1;
    } while (lVar8 < (pCVar4->vAssign).nSize);
  }
  iVar1 = pGia->nObjs;
  if ((pCVar4->vMark).nCap < iVar1) {
    pcVar7 = (pCVar4->vMark).pArray;
    if (pcVar7 == (char *)0x0) {
      pcVar7 = (char *)malloc((long)iVar1);
    }
    else {
      pcVar7 = (char *)realloc(pcVar7,(long)iVar1);
    }
    (pCVar4->vMark).pArray = pcVar7;
    (pCVar4->vMark).nCap = iVar1;
  }
  (pCVar4->vMark).nSize = iVar1;
  if (0 < iVar1) {
    lVar8 = 0;
    do {
      (pCVar4->vMark).pArray[lVar8] = '\0';
      lVar8 = lVar8 + 1;
    } while (lVar8 < (pCVar4->vMark).nSize);
  }
  iVar1 = pGia->nObjs;
  uVar3 = (long)iVar1 * 3;
  iVar10 = (int)uVar3;
  if ((pCVar4->vLevReason).nCap < iVar10) {
    piVar5 = (pCVar4->vLevReason).pArray;
    sVar9 = (long)iVar1 * 0xc;
    if (piVar5 == (int *)0x0) {
      piVar5 = (int *)malloc(sVar9);
    }
    else {
      piVar5 = (int *)realloc(piVar5,sVar9);
    }
    (pCVar4->vLevReason).pArray = piVar5;
    if (piVar5 == (int *)0x0) goto LAB_007151df;
    (pCVar4->vLevReason).nCap = iVar10;
  }
  if (0 < iVar1) {
    memset((pCVar4->vLevReason).pArray,0xff,(uVar3 & 0xffffffff) << 2);
  }
  (pCVar4->vLevReason).nSize = iVar10;
  iVar1 = pGia->nObjs;
  uVar3 = (long)iVar1 * 2;
  iVar10 = (int)uVar3;
  if ((pCVar4->vWatches).nCap < iVar10) {
    piVar5 = (pCVar4->vWatches).pArray;
    sVar9 = (long)iVar1 << 3;
    if (piVar5 == (int *)0x0) {
      piVar5 = (int *)malloc(sVar9);
    }
    else {
      piVar5 = (int *)realloc(piVar5,sVar9);
    }
    (pCVar4->vWatches).pArray = piVar5;
    if (piVar5 == (int *)0x0) goto LAB_007151df;
    (pCVar4->vWatches).nCap = iVar10;
  }
  if (0 < iVar1) {
    memset((pCVar4->vWatches).pArray,0,(uVar3 & 0xffffffff) << 2);
  }
  (pCVar4->vWatches).nSize = iVar10;
  uVar2 = pGia->nObjs;
  if ((pCVar4->vFanout0).nCap < (int)uVar2) {
    piVar5 = (pCVar4->vFanout0).pArray;
    if (piVar5 == (int *)0x0) {
      piVar5 = (int *)malloc((long)(int)uVar2 << 2);
    }
    else {
      piVar5 = (int *)realloc(piVar5,(long)(int)uVar2 << 2);
    }
    (pCVar4->vFanout0).pArray = piVar5;
    if (piVar5 == (int *)0x0) goto LAB_007151df;
    (pCVar4->vFanout0).nCap = uVar2;
  }
  if (0 < (int)uVar2) {
    memset((pCVar4->vFanout0).pArray,0,(ulong)uVar2 * 4);
  }
  (pCVar4->vFanout0).nSize = uVar2;
  iVar1 = pGia->nObjs;
  uVar3 = (long)iVar1 * 2;
  iVar10 = (int)uVar3;
  if ((pCVar4->vFanoutN).nCap < iVar10) {
    piVar5 = (pCVar4->vFanoutN).pArray;
    sVar9 = (long)iVar1 << 3;
    if (piVar5 == (int *)0x0) {
      piVar5 = (int *)malloc(sVar9);
    }
    else {
      piVar5 = (int *)realloc(piVar5,sVar9);
    }
    (pCVar4->vFanoutN).pArray = piVar5;
    if (piVar5 == (int *)0x0) goto LAB_007151df;
    (pCVar4->vFanoutN).nCap = iVar10;
  }
  if (0 < iVar1) {
    memset((pCVar4->vFanoutN).pArray,0,(uVar3 & 0xffffffff) << 2);
  }
  (pCVar4->vFanoutN).nSize = iVar10;
  uVar2 = pGia->nObjs;
  if ((pCVar4->vActivity).nCap < (int)uVar2) {
    piVar5 = (pCVar4->vActivity).pArray;
    if (piVar5 == (int *)0x0) {
      piVar5 = (int *)malloc((long)(int)uVar2 << 2);
    }
    else {
      piVar5 = (int *)realloc(piVar5,(long)(int)uVar2 << 2);
    }
    (pCVar4->vActivity).pArray = piVar5;
    if (piVar5 == (int *)0x0) goto LAB_007151df;
    (pCVar4->vActivity).nCap = uVar2;
  }
  if (0 < (int)uVar2) {
    memset((pCVar4->vActivity).pArray,0,(ulong)uVar2 * 4);
  }
  (pCVar4->vActivity).nSize = uVar2;
  if ((pCVar4->vActStore).nCap < 1000) {
    piVar5 = (pCVar4->vActStore).pArray;
    if (piVar5 == (int *)0x0) {
      piVar5 = (int *)malloc(4000);
    }
    else {
      piVar5 = (int *)realloc(piVar5,4000);
    }
    (pCVar4->vActStore).pArray = piVar5;
    if (piVar5 == (int *)0x0) goto LAB_007151df;
    (pCVar4->vActStore).nCap = 1000;
  }
  if ((pCVar4->vJStore).nCap < 1000) {
    piVar5 = (pCVar4->vJStore).pArray;
    if (piVar5 == (int *)0x0) {
      piVar5 = (int *)malloc(4000);
    }
    else {
      piVar5 = (int *)realloc(piVar5,4000);
    }
    (pCVar4->vJStore).pArray = piVar5;
    if (piVar5 == (int *)0x0) goto LAB_007151df;
    (pCVar4->vJStore).nCap = 1000;
  }
  if ((pCVar4->vWatchUpds).nCap < 1000) {
    piVar5 = (pCVar4->vWatchUpds).pArray;
    if (piVar5 == (int *)0x0) {
      piVar5 = (int *)malloc(4000);
    }
    else {
      piVar5 = (int *)realloc(piVar5,4000);
    }
    (pCVar4->vWatchUpds).pArray = piVar5;
    if (piVar5 == (int *)0x0) {
LAB_007151df:
      __assert_fail("p->pArray",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                    ,0x217,"void Vec_IntGrow(Vec_Int_t *, int)");
    }
    (pCVar4->vWatchUpds).nCap = 1000;
  }
  return pCVar4;
}

Assistant:

Cbs2_Man_t * Cbs2_ManAlloc( Gia_Man_t * pGia )
{
    Cbs2_Man_t * p;
    p = ABC_CALLOC( Cbs2_Man_t, 1 );
    p->pProp.nSize = p->pJust.nSize = p->pClauses.nSize = 10000;
    p->pProp.pData = ABC_ALLOC( int, p->pProp.nSize );
    p->pJust.pData = ABC_ALLOC( int, p->pJust.nSize );
    p->pClauses.pData = ABC_ALLOC( int, p->pClauses.nSize );
    p->pClauses.iHead = p->pClauses.iTail = 1;
    p->vModel   = Vec_IntAlloc( 1000 );
    p->vTemp    = Vec_IntAlloc( 1000 );
    p->pAig     = pGia;
    Cbs2_SetDefaultParams( &p->Pars );
    Vec_StrFill( &p->vAssign,    Gia_ManObjNum(pGia), 2 );
    Vec_StrFill( &p->vMark,      Gia_ManObjNum(pGia), 0 );
    Vec_IntFill( &p->vLevReason, 3*Gia_ManObjNum(pGia), -1 );
    Vec_IntFill( &p->vWatches,   2*Gia_ManObjNum(pGia), 0 );
    Vec_IntFill( &p->vFanout0,   Gia_ManObjNum(pGia),   0 );
    Vec_IntFill( &p->vFanoutN,   2*Gia_ManObjNum(pGia), 0 );
    Vec_IntFill( &p->vActivity,  Gia_ManObjNum(pGia), 0 );
    Vec_IntGrow( &p->vActStore,  1000 );
    Vec_IntGrow( &p->vJStore,    1000 );
    Vec_IntGrow( &p->vWatchUpds, 1000 );
    return p;
}